

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-getsockname.c
# Opt level: O2

int run_test_pipe_getsockname(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_430;
  size_t len;
  char buf [1024];
  
  puVar2 = uv_default_loop();
  if (puVar2 == (uv_loop_t *)0x0) {
    pcVar3 = "loop != NULL";
    uStack_430 = 99;
  }
  else {
    iVar1 = uv_pipe_init(puVar2,&pipe_server,0);
    if (iVar1 == 0) {
      len = 0x400;
      iVar1 = uv_pipe_getsockname(&pipe_server,buf,&len);
      if (iVar1 == -9) {
        len = 0x400;
        iVar1 = uv_pipe_getpeername(&pipe_server,buf,&len);
        if (iVar1 == -9) {
          iVar1 = uv_pipe_bind(&pipe_server,"/tmp/uv-test-sock");
          if (iVar1 == 0) {
            len = 0x400;
            iVar1 = uv_pipe_getsockname(&pipe_server,buf,&len);
            if (iVar1 == 0) {
              if (buf[len - 1] == '\0') {
                pcVar3 = "buf[len - 1] != 0";
                uStack_430 = 0x77;
              }
              else if (buf[len] == '\0') {
                iVar1 = bcmp(buf,"/tmp/uv-test-sock",len);
                if (iVar1 == 0) {
                  len = 0x400;
                  iVar1 = uv_pipe_getpeername(&pipe_server,buf,&len);
                  if (iVar1 == -0x6b) {
                    iVar1 = uv_listen((uv_stream_t *)&pipe_server,0,pipe_server_connection_cb);
                    if (iVar1 == 0) {
                      iVar1 = uv_pipe_init(puVar2,&pipe_client,0);
                      if (iVar1 == 0) {
                        len = 0x400;
                        iVar1 = uv_pipe_getsockname(&pipe_client,buf,&len);
                        if (iVar1 == -9) {
                          len = 0x400;
                          iVar1 = uv_pipe_getpeername(&pipe_client,buf,&len);
                          if (iVar1 == -9) {
                            uv_pipe_connect(&connect_req,&pipe_client,"/tmp/uv-test-sock",
                                            pipe_client_connect_cb);
                            len = 0x400;
                            iVar1 = uv_pipe_getsockname(&pipe_client,buf,&len);
                            if ((iVar1 == 0) && (len == 0)) {
                              len = 0x400;
                              iVar1 = uv_pipe_getpeername(&pipe_client,buf,&len);
                              if (iVar1 == 0) {
                                if (buf[len - 1] == '\0') {
                                  pcVar3 = "buf[len - 1] != 0";
                                  uStack_430 = 0x97;
                                }
                                else {
                                  iVar1 = bcmp(buf,"/tmp/uv-test-sock",len);
                                  if (iVar1 == 0) {
                                    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
                                    if (iVar1 == 0) {
                                      if (pipe_client_connect_cb_called == 1) {
                                        if (pipe_close_cb_called == 2) {
                                          puVar2 = uv_default_loop();
                                          close_loop(puVar2);
                                          puVar2 = uv_default_loop();
                                          iVar1 = uv_loop_close(puVar2);
                                          if (iVar1 == 0) {
                                            return 0;
                                          }
                                          pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                                          uStack_430 = 0x9f;
                                        }
                                        else {
                                          pcVar3 = "pipe_close_cb_called == 2";
                                          uStack_430 = 0x9d;
                                        }
                                      }
                                      else {
                                        pcVar3 = "pipe_client_connect_cb_called == 1";
                                        uStack_430 = 0x9c;
                                      }
                                    }
                                    else {
                                      pcVar3 = "r == 0";
                                      uStack_430 = 0x9b;
                                    }
                                  }
                                  else {
                                    pcVar3 = "memcmp(buf, TEST_PIPENAME, len) == 0";
                                    uStack_430 = 0x98;
                                  }
                                }
                              }
                              else {
                                pcVar3 = "r == 0";
                                uStack_430 = 0x95;
                              }
                            }
                            else {
                              pcVar3 = "r == 0 && len == 0";
                              uStack_430 = 0x91;
                            }
                          }
                          else {
                            pcVar3 = "r == UV_EBADF";
                            uStack_430 = 0x8b;
                          }
                        }
                        else {
                          pcVar3 = "r == UV_EBADF";
                          uStack_430 = 0x87;
                        }
                      }
                      else {
                        pcVar3 = "r == 0";
                        uStack_430 = 0x83;
                      }
                    }
                    else {
                      pcVar3 = "r == 0";
                      uStack_430 = 0x80;
                    }
                  }
                  else {
                    pcVar3 = "r == UV_ENOTCONN";
                    uStack_430 = 0x7d;
                  }
                }
                else {
                  pcVar3 = "memcmp(buf, TEST_PIPENAME, len) == 0";
                  uStack_430 = 0x79;
                }
              }
              else {
                pcVar3 = "buf[len] == \'\\0\'";
                uStack_430 = 0x78;
              }
            }
            else {
              pcVar3 = "r == 0";
              uStack_430 = 0x75;
            }
          }
          else {
            pcVar3 = "r == 0";
            uStack_430 = 0x71;
          }
        }
        else {
          pcVar3 = "r == UV_EBADF";
          uStack_430 = 0x6e;
        }
      }
      else {
        pcVar3 = "r == UV_EBADF";
        uStack_430 = 0x6a;
      }
    }
    else {
      pcVar3 = "r == 0";
      uStack_430 = 0x66;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
          ,uStack_430,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(pipe_getsockname) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#endif
  uv_loop_t* loop;
  char buf[1024];
  size_t len;
  int r;

  loop = uv_default_loop();
  ASSERT(loop != NULL);

  r = uv_pipe_init(loop, &pipe_server, 0);
  ASSERT(r == 0);

  len = sizeof buf;
  r = uv_pipe_getsockname(&pipe_server, buf, &len);
  ASSERT(r == UV_EBADF);

  len = sizeof buf;
  r = uv_pipe_getpeername(&pipe_server, buf, &len);
  ASSERT(r == UV_EBADF);

  r = uv_pipe_bind(&pipe_server, TEST_PIPENAME);
  ASSERT(r == 0);

  len = sizeof buf;
  r = uv_pipe_getsockname(&pipe_server, buf, &len);
  ASSERT(r == 0);

  ASSERT(buf[len - 1] != 0);
  ASSERT(buf[len] == '\0');
  ASSERT(memcmp(buf, TEST_PIPENAME, len) == 0);

  len = sizeof buf;
  r = uv_pipe_getpeername(&pipe_server, buf, &len);
  ASSERT(r == UV_ENOTCONN);

  r = uv_listen((uv_stream_t*) &pipe_server, 0, pipe_server_connection_cb);
  ASSERT(r == 0);

  r = uv_pipe_init(loop, &pipe_client, 0);
  ASSERT(r == 0);

  len = sizeof buf;
  r = uv_pipe_getsockname(&pipe_client, buf, &len);
  ASSERT(r == UV_EBADF);

  len = sizeof buf;
  r = uv_pipe_getpeername(&pipe_client, buf, &len);
  ASSERT(r == UV_EBADF);

  uv_pipe_connect(&connect_req, &pipe_client, TEST_PIPENAME, pipe_client_connect_cb);

  len = sizeof buf;
  r = uv_pipe_getsockname(&pipe_client, buf, &len);
  ASSERT(r == 0 && len == 0);

  len = sizeof buf;
  r = uv_pipe_getpeername(&pipe_client, buf, &len);
  ASSERT(r == 0);

  ASSERT(buf[len - 1] != 0);
  ASSERT(memcmp(buf, TEST_PIPENAME, len) == 0);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(pipe_client_connect_cb_called == 1);
  ASSERT(pipe_close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}